

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool tinygltf::ParseAudioEmitter
               (AudioEmitter *emitter,string *err,json *o,
               bool store_original_json_for_extras_and_extensions)

{
  primitive_iterator_t *this;
  json *pjVar1;
  json *pjVar2;
  bool bVar3;
  ostream *poVar4;
  string *psVar5;
  allocator local_5c9;
  string local_5c8 [39];
  allocator local_5a1;
  string local_5a0 [32];
  string local_580 [39];
  allocator local_559;
  string local_558 [39];
  allocator local_531;
  string local_530 [39];
  allocator local_509;
  string local_508 [39];
  allocator local_4e1;
  string local_4e0 [39];
  allocator local_4b9;
  string local_4b8 [39];
  allocator local_491;
  string local_490 [39];
  allocator local_469;
  string local_468 [32];
  string local_448 [39];
  allocator local_421;
  string local_420 [32];
  string local_400 [32];
  stringstream local_3e0 [8];
  stringstream ss_1;
  ostream local_3d0 [376];
  json *local_258;
  json *v;
  stringstream local_230 [8];
  stringstream ss;
  ostream local_220 [376];
  undefined1 local_a8 [8];
  json_const_iterator positionalIt;
  allocator local_51;
  string local_50 [39];
  byte local_29;
  json *pjStack_28;
  bool store_original_json_for_extras_and_extensions_local;
  json *o_local;
  string *err_local;
  AudioEmitter *emitter_local;
  
  local_29 = store_original_json_for_extras_and_extensions;
  pjStack_28 = o;
  o_local = (json *)err;
  err_local = &emitter->name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"type",&local_51);
  this = &positionalIt.m_it.primitive_iterator;
  std::__cxx11::string::string((string *)this);
  bVar3 = ParseStringProperty(&emitter->type,err,o,(string *)local_50,true,(string *)this);
  std::__cxx11::string::~string((string *)&positionalIt.m_it.primitive_iterator);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    return false;
  }
  bVar3 = std::operator==(err_local + 0x30,"positional");
  if (bVar3) {
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::iter_impl((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)local_a8);
    bVar3 = detail::FindMember(pjStack_28,"positional",(json_const_iterator *)local_a8);
    if (!bVar3) {
      if (o_local != (json *)0x0) {
        std::__cxx11::stringstream::stringstream(local_230);
        poVar4 = std::operator<<(local_220,"Positional emitter description not found.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator+=((string *)o_local,(string *)&v);
        std::__cxx11::string::~string((string *)&v);
        std::__cxx11::stringstream::~stringstream(local_230);
      }
      return false;
    }
    local_258 = detail::GetValue((json_const_iterator *)local_a8);
    bVar3 = detail::IsObject(local_258);
    if (!bVar3) {
      if (o_local != (json *)0x0) {
        std::__cxx11::stringstream::stringstream(local_3e0);
        poVar4 = std::operator<<(local_3d0,"\"positional\" is not a JSON object.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator+=((string *)o_local,local_400);
        std::__cxx11::string::~string(local_400);
        std::__cxx11::stringstream::~stringstream(local_3e0);
      }
      return false;
    }
    bVar3 = ParsePositionalEmitter
                      ((PositionalEmitter *)(err_local + 0x70),(string *)o_local,local_258,
                       (bool)(local_29 & 1));
    if (!bVar3) {
      return false;
    }
  }
  psVar5 = err_local;
  pjVar2 = o_local;
  pjVar1 = pjStack_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_420,"name",&local_421);
  std::__cxx11::string::string(local_448);
  ParseStringProperty(psVar5,(string *)pjVar2,pjVar1,(string *)local_420,false,(string *)local_448);
  std::__cxx11::string::~string(local_448);
  std::__cxx11::string::~string(local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  pjVar2 = o_local;
  pjVar1 = pjStack_28;
  psVar5 = err_local + 0x20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_468,"gain",&local_469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_490,"",&local_491);
  ParseNumberProperty((double *)psVar5,(string *)pjVar2,pjVar1,(string *)local_468,false,
                      (string *)local_490);
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  std::__cxx11::string::~string(local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  pjVar2 = o_local;
  pjVar1 = pjStack_28;
  psVar5 = err_local + 0x28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4b8,"loop",&local_4b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4e0,"",&local_4e1);
  ParseBooleanProperty
            ((bool *)psVar5,(string *)pjVar2,pjVar1,(string *)local_4b8,false,(string *)local_4e0);
  std::__cxx11::string::~string(local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  std::__cxx11::string::~string(local_4b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
  pjVar2 = o_local;
  pjVar1 = pjStack_28;
  psVar5 = err_local + 0x29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_508,"playing",&local_509);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_530,"",&local_531);
  ParseBooleanProperty
            ((bool *)psVar5,(string *)pjVar2,pjVar1,(string *)local_508,false,(string *)local_530);
  std::__cxx11::string::~string(local_530);
  std::allocator<char>::~allocator((allocator<char> *)&local_531);
  std::__cxx11::string::~string(local_508);
  std::allocator<char>::~allocator((allocator<char> *)&local_509);
  pjVar2 = o_local;
  pjVar1 = pjStack_28;
  psVar5 = err_local + 0x50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_558,"distanceModel",&local_559);
  std::__cxx11::string::string(local_580);
  ParseStringProperty(psVar5,(string *)pjVar2,pjVar1,(string *)local_558,false,(string *)local_580);
  std::__cxx11::string::~string(local_580);
  std::__cxx11::string::~string(local_558);
  std::allocator<char>::~allocator((allocator<char> *)&local_559);
  pjVar2 = o_local;
  pjVar1 = pjStack_28;
  psVar5 = err_local + 0x1a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5a0,"source",&local_5a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5c8,"",&local_5c9);
  ParseIntegerProperty
            ((int *)psVar5,(string *)pjVar2,pjVar1,(string *)local_5a0,true,(string *)local_5c8);
  std::__cxx11::string::~string(local_5c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
  std::__cxx11::string::~string(local_5a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
  ParseExtrasAndExtensions<tinygltf::AudioEmitter>
            ((AudioEmitter *)err_local,(string *)o_local,pjStack_28,(bool)(local_29 & 1));
  return true;
}

Assistant:

static bool ParseAudioEmitter(
    AudioEmitter *emitter, std::string *err, const detail::json &o,
    bool store_original_json_for_extras_and_extensions) {
  if (!ParseStringProperty(&emitter->type, err, o, "type", true)) {
    return false;
  }

  if (emitter->type == "positional") {
    detail::json_const_iterator positionalIt;
    if (!detail::FindMember(o, "positional", positionalIt)) {
      if (err) {
        std::stringstream ss;
        ss << "Positional emitter description not found." << std::endl;
        (*err) += ss.str();
      }
      return false;
    }

    const detail::json &v = detail::GetValue(positionalIt);
    if (!detail::IsObject(v)) {
      if (err) {
        std::stringstream ss;
        ss << "\"positional\" is not a JSON object." << std::endl;
        (*err) += ss.str();
      }
      return false;
    }

    if (!ParsePositionalEmitter(
            &emitter->positional, err, v,
            store_original_json_for_extras_and_extensions)) {
      return false;
    }
  }

  ParseStringProperty(&emitter->name, err, o, "name", false);
  ParseNumberProperty(&emitter->gain, err, o, "gain", false);
  ParseBooleanProperty(&emitter->loop, err, o, "loop", false);
  ParseBooleanProperty(&emitter->playing, err, o, "playing", false);
  ParseStringProperty(&emitter->distanceModel, err, o, "distanceModel", false);
  ParseIntegerProperty(&emitter->source, err, o, "source", true);

  ParseExtrasAndExtensions(emitter, err, o,
                           store_original_json_for_extras_and_extensions);

  return true;
}